

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

QString * __thiscall
QDir::relativeFilePath(QString *__return_storage_ptr__,QDir *this,QString *fileName)

{
  undefined8 str;
  undefined8 len;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  qsizetype in_R8;
  long in_FS_OFFSET;
  QStringView lhs;
  QLatin1StringView str_00;
  QLatin1StringView other;
  QStringView rhs;
  iterator fit;
  iterator dit;
  QString ret;
  undefined1 local_128 [32];
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  undefined1 local_e8 [32];
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  QString local_a8;
  QString local_88;
  QStringTokenizerBase<QStringView,_QChar> local_68;
  QStringTokenizerBase<QStringView,_QChar> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  absolutePath((QString *)local_e8,this);
  local_88.d.d = (Data *)local_e8._0_8_;
  local_88.d.ptr = (char16_t *)local_e8._8_8_;
  local_88.d.size = local_e8._16_8_;
  if ((QStringTokenizerBase<QStringView,_QChar> *)local_e8._0_8_ !=
      (QStringTokenizerBase<QStringView,_QChar> *)0x0) {
    LOCK();
    ((__atomic_base<int> *)
    &(((QStringTokenizerBaseBase *)local_e8._0_8_)->m_sb).
     super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i =
         ((__atomic_base<int> *)
         &(((QStringTokenizerBaseBase *)local_e8._0_8_)->m_sb).
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i + 1;
    UNLOCK();
  }
  qt_cleanPath(&local_88);
  if ((QStringTokenizerBase<QStringView,_QChar> *)local_e8._0_8_ !=
      (QStringTokenizerBase<QStringView,_QChar> *)0x0) {
    LOCK();
    ((__atomic_base<int> *)
    &(((QStringTokenizerBaseBase *)local_e8._0_8_)->m_sb).
     super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i =
         ((__atomic_base<int> *)
         &(((QStringTokenizerBaseBase *)local_e8._0_8_)->m_sb).
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)
        &(((QStringTokenizerBaseBase *)local_e8._0_8_)->m_sb).
         super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
    }
  }
  local_a8.d.d = (fileName->d).d;
  local_a8.d.ptr = (fileName->d).ptr;
  local_a8.d.size = (fileName->d).size;
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_a8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_a8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  qt_cleanPath(&local_a8);
  bVar4 = isRelativePath(&local_a8);
  if ((bVar4) || (bVar4 = isRelativePath(&local_88), bVar4)) {
    qVar3 = local_a8.d.size;
    pcVar2 = local_a8.d.ptr;
    pDVar1 = local_a8.d.d;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_a8.d.size = 0;
    (__return_storage_ptr__->d).size = qVar3;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_48.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
    local_48.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_48.m_haystack.m_data = local_88.d.ptr;
    local_48.m_haystack.m_size = local_88.d.size;
    local_48.m_needle.ucs = L'/';
    local_48._26_6_ = 0xaaaaaaaaaaaa;
    local_68.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
    local_68.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_68.m_haystack.m_data = local_a8.d.ptr;
    local_68.m_haystack.m_size = local_a8.d.size;
    local_68.m_needle.ucs = L'/';
    local_68._26_6_ = 0xaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_e8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QStringView,_QChar>::iterator::iterator((iterator *)local_e8,&local_48);
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
    local_128._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_128._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QStringView,_QChar>::iterator::iterator((iterator *)local_128,&local_68);
    if (local_e8[0x18] == true) {
      do {
        if (((local_128[0x18] != true) || (local_e8._16_8_ != local_128._16_8_)) ||
           (lhs.m_size = local_128._8_8_, lhs.m_data = (storage_type_conflict *)local_e8._16_8_,
           rhs.m_size = in_R8, rhs.m_data = (storage_type_conflict *)local_128._16_8_,
           bVar4 = QtPrivate::equalStrings((QtPrivate *)local_e8._8_8_,lhs,rhs), !bVar4)) break;
        QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_e8);
        QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_128);
      } while (local_e8[0x18] != false);
    }
    if (local_e8[0x18] == true) {
      do {
        str_00.m_size = 3;
        str_00.m_data = "../";
        QString::append(__return_storage_ptr__,str_00);
        QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_e8);
      } while (local_e8[0x18] != false);
    }
    if (local_128[0x18] == true) {
      do {
        len = local_128._16_8_;
        str = local_128._8_8_;
        QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_128);
        QString::append(__return_storage_ptr__,(QChar *)str,len);
        QString::append(__return_storage_ptr__,(QChar)0x2f);
      } while (local_128[0x18] != false);
      QString::chop(__return_storage_ptr__,1);
    }
    if ((__return_storage_ptr__->d).size == 0) {
      other.m_size = 1;
      other.m_data = ".";
      QString::operator=(__return_storage_ptr__,other);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QStringTokenizerBase<QStringView,_QChar> *)local_88.d.d !=
      (QStringTokenizerBase<QStringView,_QChar> *)0x0) {
    LOCK();
    ((__atomic_base<int> *)
    &(((QStringTokenizerBaseBase *)&(local_88.d.d)->super_QArrayData)->m_sb).
     super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i =
         ((__atomic_base<int> *)
         &(((QStringTokenizerBaseBase *)&(local_88.d.d)->super_QArrayData)->m_sb).
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)
        &(((QStringTokenizerBaseBase *)&(local_88.d.d)->super_QArrayData)->m_sb).
         super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDir::relativeFilePath(const QString &fileName) const
{
    QString dir = cleanPath(absolutePath());
    QString file = cleanPath(fileName);

    if (isRelativePath(file) || isRelativePath(dir))
        return file;

#ifdef Q_OS_WIN
    QString dirDrive = driveSpec(dir);
    QString fileDrive = driveSpec(file);

    bool fileDriveMissing = false;
    if (fileDrive.isEmpty()) {
        fileDrive = dirDrive;
        fileDriveMissing = true;
    }

    if (fileDrive.toLower() != dirDrive.toLower()
            || (file.startsWith("//"_L1)
                && !dir.startsWith("//"_L1))) {
        return file;
    }

    dir.remove(0, dirDrive.size());
    if (!fileDriveMissing)
        file.remove(0, fileDrive.size());
#endif

    QString result;
    const auto dirElts = dir.tokenize(u'/', Qt::SkipEmptyParts);
    const auto fileElts = file.tokenize(u'/', Qt::SkipEmptyParts);

    const auto dend = dirElts.end();
    const auto fend = fileElts.end();
    auto dit = dirElts.begin();
    auto fit = fileElts.begin();

    const auto eq = [](QStringView lhs, QStringView rhs) {
        return
#if defined(Q_OS_WIN)
           lhs.compare(rhs, Qt::CaseInsensitive) == 0;
#else
           lhs == rhs;
#endif
    };

    // std::ranges::mismatch
    while (dit != dend && fit != fend && eq(*dit, *fit)) {
        ++dit;
        ++fit;
    }

    while (dit != dend) {
        result += "../"_L1;
        ++dit;
    }

    if (fit != fend) {
        while (fit != fend) {
            result += *fit++;
            result += u'/';
        }
        result.chop(1);
    }

    if (result.isEmpty())
        result = "."_L1;
    return result;
}